

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O0

void __thiscall btClock::reset(btClock *this)

{
  undefined8 *in_RDI;
  
  gettimeofday((timeval *)*in_RDI,(__timezone_ptr_t)0x0);
  return;
}

Assistant:

void btClock::reset()
{
#ifdef BT_USE_WINDOWS_TIMERS
	QueryPerformanceCounter(&m_data->mStartTime);
	m_data->mStartTick = GetTickCount64();
	m_data->mPrevElapsedTime = 0;
#else
#ifdef __CELLOS_LV2__

	typedef uint64_t  ClockSize;
	ClockSize newTime;
	//__asm __volatile__( "mftb %0" : "=r" (newTime) : : "memory");
	SYS_TIMEBASE_GET( newTime );
	m_data->mStartTime = newTime;
#else
	gettimeofday(&m_data->mStartTime, 0);
#endif
#endif
}